

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdns.c
# Opt level: O1

void test_readcb(int fd,short what,void *_arg)

{
  byte *pbVar1;
  ushort uVar2;
  uint uVar3;
  long lVar4;
  _Bool _Var5;
  uint16_t uVar6;
  int iVar7;
  size_t len;
  long lVar8;
  long lVar9;
  long lVar10;
  timeval tv;
  char ip_str [55];
  char buf [4096];
  
  if (((((what & 1U) == 0) &&
       (len = recvfrom(fd,buf,0x1000,0,(sockaddr *)0x0,(socklen_t *)0x0), 0xc < len + 1)) &&
      ((buf[3] & 0xfU) == 0)) && (buf._0_2_ == *(short *)((long)_arg + 0x28))) {
    fmt_sockaddr_port((sockaddr *)(*(long *)((long)_arg + 0x18) + 0x10),ip_str,0x37);
    gettimeofday((timeval *)&tv,(__timezone_ptr_t)0x0);
    lVar8 = tv.tv_sec - *(long *)((long)_arg + 8);
    lVar9 = tv.tv_usec - *(long *)((long)_arg + 0x10);
    lVar10 = lVar9 + 1000000;
    if (-1 < lVar9) {
      lVar10 = lVar9;
    }
    uVar3 = *(uint *)(*(long *)((long)_arg + 0x18) + 0x90);
    *(ushort *)(*(long *)((long)_arg + 0x18) + 0x90) = (ushort)uVar3 | 0x8000;
    if ((uVar3 & 1) == 0) {
      uVar6 = dns_get_edns_udp_payload_size(buf,len);
      lVar4 = *(long *)((long)_arg + 0x18);
      *(uint16_t *)(lVar4 + 0x92) = uVar6;
      if ((uVar6 != 0) && ((*(byte *)(lVar4 + 0x91) & 0x40) == 0)) {
        _Var5 = is_google_dns((sockaddr *)(lVar4 + 0x10));
        if ((_Var5) && (*(short *)(*(long *)((long)_arg + 0x18) + 0x92) != 0x200)) {
          pbVar1 = (byte *)(*(long *)((long)_arg + 0x18) + 0x91);
          *pbVar1 = *pbVar1 | 0x40;
        }
        if ((*(byte *)(*(long *)((long)_arg + 0x18) + 0x91) & 0x40) != 0) {
          _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",
                     0x2dc,"test_readcb",0,6,
                     "Oops! DNS server %s is hijacked with UDP payload size: %u",ip_str,
                     (ulong)*(ushort *)(*(long *)((long)_arg + 0x18) + 0x92));
        }
      }
      lVar4 = *(long *)((long)_arg + 0x18);
      if ((*(ushort *)(lVar4 + 0x92) != 0) && ((*(uint *)(lVar4 + 0x90) >> 0xe & 1) == 0)) {
        *(ushort *)(lVar4 + 0x90) = (ushort)*(uint *)(lVar4 + 0x90) | 1;
        _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",
                   0x2e2,"test_readcb",0,6,
                   "Cool! DNS server %s supports EDNS with UDP payload size: %u",ip_str,
                   (ulong)*(ushort *)(lVar4 + 0x92));
      }
    }
    uVar2 = *(ushort *)(*(long *)((long)_arg + 0x18) + 0x90);
    if (((uVar2 & 0x4002) == 0) && (buf._8_2_ != 0)) {
      *(ushort *)(*(long *)((long)_arg + 0x18) + 0x90) = uVar2 | 2;
      _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",0x2e8
                 ,"test_readcb",0,6,"Cool! DNS server %s returns authority records",ip_str);
    }
    lVar8 = (lVar9 >> 0x3f) + lVar8;
    if (*(short *)(*(long *)((long)_arg + 0x18) + 0x92) == 0) {
      tv.tv_sec = (ulong)g_cdns_cfg.timeout - lVar8;
      tv.tv_usec = -lVar10;
      if (0 < lVar10) {
        tv.tv_sec = tv.tv_sec + -1;
        tv.tv_usec = 1000000 - lVar10;
      }
      iVar7 = event_add(*(undefined8 *)((long)_arg + 0x20),&tv);
      if (iVar7 == 0) {
        return;
      }
      _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",0x2f5
                 ,"test_readcb",1,3,"event_add");
    }
    else {
      *(int *)(*(long *)((long)_arg + 0x18) + 0xa4) = (int)lVar8 * 1000 + (int)(lVar10 / 1000);
    }
  }
  if (*(long *)((long)_arg + 0x20) != 0) {
    event_free();
  }
  free(_arg);
  evutil_closesocket(fd);
  return;
}

Assistant:

static void test_readcb(int fd, short what, void *_arg)
{
    struct dns_test_request_t * req = _arg;
    struct timeval tv, rtt;
    char   ip_str[INET_ADDR_PORT_STRLEN];
    char   buf[DEFAULT_BUFFER_SIZE];
    size_t pktlen;
    struct dns_header_t * hdr = (struct dns_header_t *)buf;

    if (what & EV_TIMEOUT)
        goto finish;

    pktlen = recvfrom(fd, buf, sizeof(buf), 0, NULL, NULL);
    if (pktlen == -1 || pktlen < sizeof(*hdr) || (hdr->rcode != DNS_RC_NOERROR))
        goto finish;

    if (hdr->id != req->id)
        goto finish;

    fmt_sockaddr_port((struct sockaddr *)&req->server->addr, &ip_str[0], sizeof(ip_str));
    gettimeofday(&tv, 0);
    timersub(&tv, &req->test_start, &rtt);
    time_t rtt_ms = rtt.tv_sec * 1000 + rtt.tv_usec/1000;

    req->server->flags |= SF_TEST_DONE;// Server receives response

    /*
    if (req->server->hijack_threshold > 0 && rtt_ms <= req->server->hijack_threshold) {
        log_error(LOG_DEBUG,
                  "Ignore fast response from %s in %ldms(Threshold: %ums)!",
                  &ip_str[0], rtt_ms, req->server->hijack_threshold);
    }
    */
    if (!(req->server->flags & SF_EDNS_OPT)) {
        req->server->edns_udp_size = dns_get_edns_udp_payload_size(&buf[0], pktlen);

        if (req->server->edns_udp_size && !(req->server->flags & SF_HIJACKED)) {
            if (is_google_dns((const struct sockaddr *)&req->server->addr)
                && req->server->edns_udp_size != 512) {
                req->server->flags |= SF_HIJACKED;
            }
            if (req->server->flags & SF_HIJACKED) {
                log_error(LOG_INFO, "Oops! DNS server %s is hijacked with UDP payload size: %u",
                          &ip_str[0], req->server->edns_udp_size);
            }
        }
        if (req->server->edns_udp_size && !(req->server->flags & SF_HIJACKED)) {
            req->server->flags |= SF_EDNS_OPT;
            log_error(LOG_INFO, "Cool! DNS server %s supports EDNS with UDP payload size: %u",
                      &ip_str[0], req->server->edns_udp_size);
        }
    }
    if (!(req->server->flags & (SF_NSCOUNT | SF_HIJACKED))) {
        if (ntohs(hdr->nscount) > 0) {
            req->server->flags |= SF_NSCOUNT;
            log_error(LOG_INFO, "Cool! DNS server %s returns authority records", &ip_str[0]);
        }
    }
    if (req->server->edns_udp_size) {
        // FIXME: update server average rtt
        req->server->stats.avg_rtt = rtt_ms;
    }
    else {
        // Set timeout and wait for next response.
        tv.tv_sec = g_cdns_cfg.timeout;
        tv.tv_usec = 0;
        timersub(&tv, &rtt, &tv);
        if (event_add(req->resolver, &tv)) {
            log_errno(LOG_ERR, "event_add");
            goto finish;
        }    
        return;
    }
finish:
    if (req->resolver)
        event_free(req->resolver);
    free(req);
    evutil_closesocket(fd);
}